

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O0

Result __thiscall
wabt::interp::Table::Init
          (Table *this,Store *store,u32 dst_offset,ElemSegment *src,u32 src_offset,u32 size)

{
  bool bVar1;
  ElemDesc *pEVar2;
  RefVec *pRVar3;
  __normal_iterator<wabt::interp::Ref_*,_std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>_>
  local_80;
  Ref *local_78;
  __normal_iterator<const_wabt::interp::Ref_*,_std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>_>
  local_70;
  __normal_iterator<const_wabt::interp::Ref_*,_std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>_>
  local_68;
  __normal_iterator<const_wabt::interp::Ref_*,_std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>_>
  local_60;
  __normal_iterator<const_wabt::interp::Ref_*,_std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>_>
  local_58;
  __normal_iterator<const_wabt::interp::Ref_*,_std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>_>
  local_50;
  ValueType local_48;
  ValueType local_40;
  u32 local_38;
  u32 local_34;
  u32 size_local;
  u32 src_offset_local;
  ElemSegment *src_local;
  Store *pSStack_20;
  u32 dst_offset_local;
  Store *store_local;
  Table *this_local;
  
  local_38 = size;
  local_34 = src_offset;
  _size_local = src;
  src_local._4_4_ = dst_offset;
  pSStack_20 = store;
  store_local = (Store *)this;
  bVar1 = IsValidRange(this,dst_offset,size);
  if ((bVar1) && (bVar1 = ElemSegment::IsValidRange(_size_local,local_34,local_38), bVar1)) {
    local_40 = *(ValueType *)&(this->type_).super_ExternType.field_0xc;
    pEVar2 = ElemSegment::desc(_size_local);
    local_48 = pEVar2->type;
    bVar1 = TypesMatch(local_40,local_48);
    if (bVar1) {
      pRVar3 = ElemSegment::elements(_size_local);
      local_58._M_current =
           (Ref *)std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::begin(pRVar3);
      local_50 = __gnu_cxx::
                 __normal_iterator<const_wabt::interp::Ref_*,_std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>_>
                 ::operator+(&local_58,(ulong)local_34);
      pRVar3 = ElemSegment::elements(_size_local);
      local_70._M_current =
           (Ref *)std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::begin(pRVar3);
      local_68 = __gnu_cxx::
                 __normal_iterator<const_wabt::interp::Ref_*,_std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>_>
                 ::operator+(&local_70,(ulong)local_34);
      local_60 = __gnu_cxx::
                 __normal_iterator<const_wabt::interp::Ref_*,_std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>_>
                 ::operator+(&local_68,(ulong)local_38);
      local_80._M_current =
           (Ref *)std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::begin
                            (&this->elements_);
      local_78 = (Ref *)__gnu_cxx::
                        __normal_iterator<wabt::interp::Ref_*,_std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>_>
                        ::operator+(&local_80,(ulong)src_local._4_4_);
      std::
      copy<__gnu_cxx::__normal_iterator<wabt::interp::Ref_const*,std::vector<wabt::interp::Ref,std::allocator<wabt::interp::Ref>>>,__gnu_cxx::__normal_iterator<wabt::interp::Ref*,std::vector<wabt::interp::Ref,std::allocator<wabt::interp::Ref>>>>
                (local_50,local_60,
                 (__normal_iterator<wabt::interp::Ref_*,_std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>_>
                  )local_78);
      Result::Result((Result *)((long)&this_local + 4),Ok);
      return (Result)this_local._4_4_;
    }
  }
  Result::Result((Result *)((long)&this_local + 4),Error);
  return (Result)this_local._4_4_;
}

Assistant:

Result Table::Init(Store& store,
                   u32 dst_offset,
                   const ElemSegment& src,
                   u32 src_offset,
                   u32 size) {
  if (IsValidRange(dst_offset, size) && src.IsValidRange(src_offset, size) &&
      TypesMatch(type_.element, src.desc().type)) {
    std::copy(src.elements().begin() + src_offset,
              src.elements().begin() + src_offset + size,
              elements_.begin() + dst_offset);
    return Result::Ok;
  }
  return Result::Error;
}